

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_5f0810::HandleSourceMode
               (cmExecutionStatus *status,string *name,OutType infoType,string *variable,
               string *propertyName,cmMakefile *directory_makefile,
               bool source_file_paths_should_be_absolute)

{
  string *psVar1;
  OutType infoType_00;
  ulong uVar2;
  cmMakefile *makefile;
  cmAlphaNum local_138;
  cmAlphaNum local_108;
  string local_d8;
  undefined4 local_b4;
  string *local_b0;
  cmSourceFile *local_a8;
  cmSourceFile *sf;
  string source_file_absolute_path;
  allocator<char> local_69;
  string local_68;
  byte local_41;
  cmMakefile *pcStack_40;
  bool source_file_paths_should_be_absolute_local;
  cmMakefile *directory_makefile_local;
  string *propertyName_local;
  string *variable_local;
  string *psStack_20;
  OutType infoType_local;
  string *name_local;
  cmExecutionStatus *status_local;
  
  local_41 = source_file_paths_should_be_absolute;
  pcStack_40 = directory_makefile;
  directory_makefile_local = (cmMakefile *)propertyName;
  propertyName_local = variable;
  variable_local._4_4_ = infoType;
  psStack_20 = name;
  name_local = (string *)status;
  uVar2 = std::__cxx11::string::empty();
  psVar1 = name_local;
  if ((uVar2 & 1) == 0) {
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded
              ((string *)&sf,(cmExecutionStatus *)name_local,psStack_20,(bool)(local_41 & 1));
    local_a8 = cmMakefile::GetOrCreateSource(pcStack_40,(string *)&sf,false,Ambiguous);
    psVar1 = name_local;
    infoType_00 = variable_local._4_4_;
    if (local_a8 == (cmSourceFile *)0x0) {
      cmAlphaNum::cmAlphaNum(&local_108,"given SOURCE name that could not be found or created: ");
      cmAlphaNum::cmAlphaNum(&local_138,(string *)&sf);
      cmStrCat<>(&local_d8,&local_108,&local_138);
      cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      status_local._7_1_ = false;
    }
    else {
      makefile = cmExecutionStatus::GetMakefile((cmExecutionStatus *)name_local);
      psVar1 = propertyName_local;
      local_b0 = (string *)
                 cmSourceFile::GetPropertyForUser(local_a8,(string *)directory_makefile_local);
      status_local._7_1_ = StoreResult<cmValue>(infoType_00,makefile,psVar1,(cmValue)local_b0);
    }
    local_b4 = 1;
    std::__cxx11::string::~string((string *)&sf);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"not given name for SOURCE scope.",&local_69);
    cmExecutionStatus::SetError((cmExecutionStatus *)psVar1,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    status_local._7_1_ = 0;
  }
  return (bool)(status_local._7_1_ & 1);
}

Assistant:

bool HandleSourceMode(cmExecutionStatus& status, const std::string& name,
                      OutType infoType, const std::string& variable,
                      const std::string& propertyName,
                      cmMakefile& directory_makefile,
                      const bool source_file_paths_should_be_absolute)
{
  if (name.empty()) {
    status.SetError("not given name for SOURCE scope.");
    return false;
  }

  // Get the source file.
  const std::string source_file_absolute_path =
    SetPropertyCommand::MakeSourceFilePathAbsoluteIfNeeded(
      status, name, source_file_paths_should_be_absolute);
  if (cmSourceFile* sf =
        directory_makefile.GetOrCreateSource(source_file_absolute_path)) {
    return StoreResult(infoType, status.GetMakefile(), variable,
                       sf->GetPropertyForUser(propertyName));
  }
  status.SetError(
    cmStrCat("given SOURCE name that could not be found or created: ",
             source_file_absolute_path));
  return false;
}